

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O1

void RemoveExistingObjectFromDictionary(JlDataObject *DictionaryObject,char *KeyName)

{
  JL_STATUS JVar1;
  JlDataObject *object;
  JlDataObject *local_18;
  
  local_18 = (JlDataObject *)0x0;
  JVar1 = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&local_18);
  if (JVar1 == JL_STATUS_SUCCESS) {
    JVar1 = JlDetachObjectFromDictionaryObject(DictionaryObject,KeyName);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JlFreeObjectTree(&local_18);
    }
  }
  return;
}

Assistant:

static
void
    RemoveExistingObjectFromDictionary
    (
        JlDataObject*               DictionaryObject,
        char const*                 KeyName
    )
{
    JL_STATUS jlStatus;
    JlDataObject* object = NULL;

    jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlDetachObjectFromDictionaryObject( DictionaryObject, KeyName );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlFreeObjectTree( &object );
        }
        else
        {
            jlStatus = JL_STATUS_INTERNAL_ERROR;
        }
    }
}